

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UBool icu_63::TimeZoneFormat::toCodePoints(UnicodeString *str,UChar32 *codeArray,int32_t size)

{
  int32_t iVar1;
  UChar32 UVar2;
  int32_t local_30;
  int local_2c;
  int32_t start;
  int32_t idx;
  int32_t count;
  int32_t size_local;
  UChar32 *codeArray_local;
  UnicodeString *str_local;
  
  iVar1 = UnicodeString::countChar32(str,0,0x7fffffff);
  if (iVar1 == size) {
    local_30 = 0;
    for (local_2c = 0; local_2c < size; local_2c = local_2c + 1) {
      UVar2 = UnicodeString::char32At(str,local_30);
      codeArray[local_2c] = UVar2;
      local_30 = UnicodeString::moveIndex32(str,local_30,1);
    }
    str_local._7_1_ = '\x01';
  }
  else {
    str_local._7_1_ = '\0';
  }
  return str_local._7_1_;
}

Assistant:

UBool
TimeZoneFormat::toCodePoints(const UnicodeString& str, UChar32* codeArray, int32_t size) {
    int32_t count = str.countChar32();
    if (count != size) {
        return FALSE;
    }

    for (int32_t idx = 0, start = 0; idx < size; idx++) {
        codeArray[idx] = str.char32At(start);
        start = str.moveIndex32(start, 1);
    }

    return TRUE;
}